

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

bool __thiscall duckdb::Node::HasByte(Node *this,ART *art,uint8_t *byte)

{
  _Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false> _Var1;
  idx_t iVar2;
  ulong uVar3;
  NType NVar4;
  type paVar5;
  long *plVar6;
  pointer pFVar7;
  data_ptr_t pdVar8;
  InternalException *this_00;
  __hash_code __code;
  ulong uVar9;
  long *plVar10;
  ulong uVar11;
  NType value;
  uint uVar12;
  long lVar13;
  string local_60;
  string local_40;
  
  uVar11 = (this->super_IndexPointer).data;
  NVar4 = (NType)(uVar11 >> 0x38);
  value = NVar4 & 0x7f;
  uVar12 = (uint)(uVar11 >> 0x20);
  if (value == NODE_256_LEAF) {
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[8].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar11 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar6 = plVar10;
    }
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar6 + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,true);
    return (*(ulong *)(pdVar8 + (ulong)(*byte >> 6) * 8 +
                                (_Var1._M_head_impl)->bitmask_offset +
                                (ulong)(uVar12 & 0xffffff) * (_Var1._M_head_impl)->segment_size + 8)
            >> ((ulong)*byte & 0x3f) & 1) != 0;
  }
  NVar4 = NVar4 & 0x7f;
  if (NVar4 == NODE_15_LEAF) {
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[7].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar11 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar6 = plVar10;
    }
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar6 + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
    lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    uVar11 = (ulong)pdVar8[iVar2 + lVar13];
    if (uVar11 == 0) {
      return uVar11 != 0;
    }
    if (pdVar8[iVar2 + lVar13 + 1] == *byte) {
      return true;
    }
    uVar3 = 1;
    do {
      uVar9 = uVar3;
      if (uVar11 == uVar9) break;
      uVar3 = uVar9 + 1;
    } while (pdVar8[uVar9 + iVar2 + lVar13 + 1] != *byte);
  }
  else {
    if (NVar4 != NODE_7_LEAF) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_60,"Invalid node type for GetNextByte: %s.","");
      EnumUtil::ToString<duckdb::NType>(&local_40,value);
      InternalException::InternalException<std::__cxx11::string>(this_00,&local_60,&local_40);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    paVar5 = shared_ptr<std::array<duckdb::unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>,_false>,_9UL>,_true>
             ::operator*(&art->allocators);
    _Var1._M_head_impl =
         paVar5->_M_elems[6].
         super_unique_ptr<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::FixedSizeAllocator,_std::default_delete<duckdb::FixedSizeAllocator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::FixedSizeAllocator_*,_std::default_delete<duckdb::FixedSizeAllocator>_>
         .super__Head_base<0UL,_duckdb::FixedSizeAllocator_*,_false>._M_head_impl;
    plVar6 = *(long **)(*(long *)&((_Var1._M_head_impl)->buffers)._M_h +
                       ((uVar11 & 0xffffffff) %
                       *(size_type *)((long)&(_Var1._M_head_impl)->buffers + 8)) * 8);
    for (plVar10 = (long *)*plVar6; (uVar11 & 0xffffffff) != plVar10[1]; plVar10 = (long *)*plVar10)
    {
      plVar6 = plVar10;
    }
    pFVar7 = unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
             ::operator->((unique_ptr<duckdb::FixedSizeBuffer,_std::default_delete<duckdb::FixedSizeBuffer>,_true>
                           *)(*plVar6 + 0x10));
    pdVar8 = FixedSizeBuffer::Get(pFVar7,false);
    lVar13 = (ulong)(uVar12 & 0xffffff) * (_Var1._M_head_impl)->segment_size;
    iVar2 = (_Var1._M_head_impl)->bitmask_offset;
    uVar11 = (ulong)pdVar8[iVar2 + lVar13];
    if (uVar11 == 0) {
      return uVar11 != 0;
    }
    if (pdVar8[iVar2 + lVar13 + 1] == *byte) {
      return true;
    }
    uVar3 = 1;
    do {
      uVar9 = uVar3;
      if (uVar11 == uVar9) break;
      uVar3 = uVar9 + 1;
    } while (pdVar8[uVar9 + iVar2 + lVar13 + 1] != *byte);
  }
  return uVar9 < uVar11;
}

Assistant:

bool Node::HasByte(ART &art, uint8_t &byte) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_7_LEAF:
		return Ref<const Node7Leaf>(art, *this, NType::NODE_7_LEAF).HasByte(byte);
	case NType::NODE_15_LEAF:
		return Ref<const Node15Leaf>(art, *this, NType::NODE_15_LEAF).HasByte(byte);
	case NType::NODE_256_LEAF:
		return Ref<Node256Leaf>(art, *this, NType::NODE_256_LEAF).HasByte(byte);
	default:
		throw InternalException("Invalid node type for GetNextByte: %s.", EnumUtil::ToString(type));
	}
}